

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_sanguine_ward(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *in_RDX;
  int in_ESI;
  int in_EDI;
  int charges;
  AFFECT_DATA af;
  AFFECT_DATA *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  int charges_00;
  int in_stack_ffffffffffffff6c;
  int iVar4;
  int in_stack_ffffffffffffff70;
  int iVar5;
  int iVar6;
  
  iVar5 = 1;
  if ((*target_name != '\0') && (bVar1 = is_number((char *)in_stack_ffffffffffffff58), bVar1)) {
    iVar5 = atoi(target_name);
  }
  if (iVar5 < 1) {
    iVar5 = in_stack_ffffffffffffff64;
    charges_00 = 1;
  }
  else {
    charges_00 = iVar5;
    if (5 < iVar5) {
      iVar5 = 5;
      charges_00 = iVar5;
    }
  }
  iVar6 = charges_00;
  bVar1 = drain_urn(in_RDX,charges_00);
  if (bVar1) {
    bVar1 = is_affected(in_RDX,in_EDI);
    if (bVar1) {
      send_to_char((char *)CONCAT44(iVar6,in_stack_ffffffffffffff70),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,charges_00));
    }
    else {
      init_affect((AFFECT_DATA *)0x61e252);
      iVar2 = in_ESI / 5;
      iVar3 = iVar6 << 1;
      iVar4 = 7;
      std::min<int>((int *)&stack0xffffffffffffff70,(int *)&stack0xffffffffffffff6c);
      affect_to_char((CHAR_DATA *)CONCAT44(iVar5,iVar2),in_stack_ffffffffffffff58);
      send_to_char((char *)CONCAT44(iVar6,iVar3),(CHAR_DATA *)CONCAT44(iVar4,charges_00));
      send_to_char((char *)CONCAT44(iVar6,iVar3),(CHAR_DATA *)CONCAT44(iVar4,charges_00));
      act((char *)CONCAT44(iVar6,iVar3),(CHAR_DATA *)CONCAT44(iVar4,charges_00),
          (void *)CONCAT44(iVar5,iVar2),in_stack_ffffffffffffff58,0);
      act((char *)CONCAT44(iVar6,iVar3),(CHAR_DATA *)CONCAT44(iVar4,charges_00),
          (void *)CONCAT44(iVar5,iVar2),in_stack_ffffffffffffff58,0);
      if ((2 < iVar6) && (iVar6 != 5)) {
        send_to_char((char *)CONCAT44(iVar6,iVar3),(CHAR_DATA *)CONCAT44(iVar4,charges_00));
        act((char *)CONCAT44(iVar6,iVar3),(CHAR_DATA *)CONCAT44(iVar4,charges_00),
            (void *)CONCAT44(iVar5,iVar2),in_stack_ffffffffffffff58,0);
      }
      if (iVar6 == 5) {
        send_to_char((char *)CONCAT44(5,iVar3),(CHAR_DATA *)CONCAT44(iVar4,charges_00));
        act((char *)CONCAT44(iVar6,iVar3),(CHAR_DATA *)CONCAT44(iVar4,charges_00),
            (void *)CONCAT44(iVar5,iVar2),in_stack_ffffffffffffff58,0);
      }
      send_to_char((char *)CONCAT44(iVar6,iVar3),(CHAR_DATA *)CONCAT44(iVar4,charges_00));
    }
  }
  return;
}

Assistant:

void spell_sanguine_ward(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	int charges = 1;

	if (target_name[0] != '\0' && is_number(target_name))
		charges = atoi(target_name);

	charges = URANGE(1, charges, 5);

	if (!drain_urn(ch, charges))
		return;

	if (is_affected(ch, sn))
	{
		send_to_char("You are already warded.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.location = 0;
	af.modifier = charges;
	af.duration = level / 5 + std::min(charges * 2, 7);
	af.type = sn;
	af.level = level;
	af.mod_name = MOD_PROTECTION;
	affect_to_char(ch, &af);

	send_to_char("Using the blood from your urn, you trace a symbol upon your forehead.\n\r", ch);
	send_to_char("A translucent red shield flickers into existence around you.\n\r", ch);

	act("$n dips a finger into $s urn and traces a symbol onto $s forehead.", ch, 0, 0, TO_ROOM);
	act("A translucent red shield flickers into existence around $n.", ch, 0, 0, TO_ROOM);

	if (charges > 2 && charges != 5)
	{
		send_to_char("The strong ward seems nearly solid for a moment before fading back to translucence.\n\r", ch);
		act("The ward around $n seems nearly solid for a moment before fading back to translucence.", ch, 0, 0, TO_ROOM);
	}

	if (charges == 5)
	{
		send_to_char("Your surroundings seem to blur momentarily as the powerful ward coalesces around you.\n\r", ch);
		act("$n seems to flicker out of existence momentarily as the powerful ward coalesces around $m.", ch, 0, 0, TO_ROOM);
	}

	send_to_char("\n\r", ch);
}